

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * __thiscall mocker::Lexer::getToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  reference pcVar5;
  bool local_a1;
  allocator<char> local_81;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  allocator<char> local_69;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  allocator<char> local_51;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_3d;
  char now;
  allocator<char> local_29;
  anon_class_8_1_8991fb9c local_28;
  anon_class_8_1_8991fb9c skipComment;
  anon_class_8_1_8991fb9c skipWs;
  Lexer *this_local;
  
  local_28.this = this;
  skipComment.this = this;
  do {
    bVar2 = getToken::anon_class_8_1_8991fb9c::operator()(&skipComment);
    local_a1 = true;
    if (!bVar2) {
      local_a1 = getToken::anon_class_8_1_8991fb9c::operator()(&local_28);
    }
  } while (local_a1 != false);
  bVar2 = __gnu_cxx::operator==(&this->nxtBeg,&this->srcEnd);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    (this->curBeg)._M_current = (this->nxtBeg)._M_current;
    (this->curPos).line = (this->nxtPos).line;
    (this->curPos).col = (this->nxtPos).col;
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->nxtBeg);
    iVar4 = ispunct((int)*pcVar5);
    if (iVar4 == 0) {
      while( true ) {
        bVar3 = __gnu_cxx::operator!=(&this->nxtBeg,&this->srcEnd);
        bVar2 = false;
        if (bVar3) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&this->nxtBeg);
          iVar4 = isalnum((int)*pcVar5);
          bVar2 = true;
          if (iVar4 == 0) {
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&this->nxtBeg);
            bVar2 = *pcVar5 == '_';
          }
        }
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&this->nxtBeg);
        (this->nxtPos).col = (this->nxtPos).col + 1;
      }
      local_78._M_current = (this->curBeg)._M_current;
      local_80._M_current = (this->nxtBeg)._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)__return_storage_ptr__,local_78,local_80,&local_81);
      std::allocator<char>::~allocator(&local_81);
    }
    else {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&this->nxtBeg);
      local_3d = *pcVar5;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&this->nxtBeg);
      (this->nxtPos).col = (this->nxtPos).col + 1;
      bVar2 = __gnu_cxx::operator==(&this->nxtBeg,&this->srcEnd);
      cVar1 = local_3d;
      if (bVar2) {
        local_48._M_current = (this->curBeg)._M_current;
        local_50._M_current = (this->nxtBeg)._M_current;
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)__return_storage_ptr__,local_48,local_50,&local_51);
        std::allocator<char>::~allocator(&local_51);
      }
      else {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&this->nxtBeg);
        if ((cVar1 == *pcVar5) &&
           (((((local_3d == '-' || (local_3d == '+')) || (local_3d == '=')) ||
             ((local_3d == '<' || (local_3d == '>')))) || ((local_3d == '&' || (local_3d == '|')))))
           ) {
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&this->nxtBeg);
          (this->nxtPos).col = (this->nxtPos).col + 1;
        }
        else {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&this->nxtBeg);
          if ((*pcVar5 == '=') && ((local_3d == '<' || (local_3d == '>')))) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&this->nxtBeg);
            (this->nxtPos).col = (this->nxtPos).col + 1;
          }
          else if ((local_3d == '!') &&
                  (pcVar5 = __gnu_cxx::
                            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&this->nxtBeg), *pcVar5 == '=')) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&this->nxtBeg);
            (this->nxtPos).col = (this->nxtPos).col + 1;
          }
        }
        local_60._M_current = (this->curBeg)._M_current;
        local_68._M_current = (this->nxtBeg)._M_current;
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)__return_storage_ptr__,local_60,local_68,&local_69);
        std::allocator<char>::~allocator(&local_69);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getToken() {
  // skip the whitespaces and comments
  auto skipWs = [this]() -> bool /* skipped something? */ {
    bool res = false;
    while (nxtBeg != srcEnd && std::isspace(*nxtBeg)) {
      res = true;
      ++nxtPos.col;
      if (*nxtBeg == '\n') {
        ++nxtPos.line;
        nxtPos.col = 1;
      }
      ++nxtBeg;
    }
    return res;
  };
  auto skipComment = [this]() -> bool {
    if (srcEnd - nxtBeg < 2 || *nxtBeg != '/' || *(nxtBeg + 1) != '/')
      return false;
    while (nxtBeg != srcEnd && *nxtBeg != '\n')
      ++nxtBeg;
    if (*nxtBeg == '\n')
      ++nxtBeg;
    ++nxtPos.line;
    nxtPos.col = 1;
    return true;
  };
  while (skipWs() || skipComment())
    ;

  if (nxtBeg == srcEnd)
    return "";

  curBeg = nxtBeg;
  curPos = nxtPos;
  if (std::ispunct(*nxtBeg)) {
    auto now = *nxtBeg;
    ++nxtBeg;
    ++nxtPos.col;
    if (nxtBeg == srcEnd)
      return {curBeg, nxtBeg};

    if (now == *nxtBeg &&
        (now == '-' || now == '+' || now == '=' || now == '<' || now == '>' ||
         now == '&' || now == '|')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (*nxtBeg == '=' && (now == '<' || now == '>')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (now == '!' && *nxtBeg == '=') {
      ++nxtBeg;
      ++nxtPos.col;
    }
    return {curBeg, nxtBeg};
  }
  while (nxtBeg != srcEnd && (std::isalnum(*nxtBeg) || *nxtBeg == '_')) {
    ++nxtBeg;
    ++nxtPos.col;
  }
  return {curBeg, nxtBeg};
}